

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>::iterator,_bool>
* __thiscall
phmap::container_internal::
parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
::
emplace_decomposable<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_short&&>>
          (pair<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,unsigned_long *key,piecewise_construct_t *args,
          tuple<unsigned_long_&> *args_1,tuple<unsigned_short_&&> *args_2)

{
  ulong hash;
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>::iterator,_bool>
  local_40;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *key;
  hash = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,8) +
         SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,0);
  uVar4 = (ulong)((((uint)(hash >> 4) & 0xfffffff ^ (uint)hash) & 0xf) << 6);
  raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
  ::
  emplace_decomposable<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_short&&>>
            (&local_40,
             (raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
              *)((long)this + uVar4),key,hash,args,args_1,args_2);
  lVar1 = *(long *)((long)this + uVar4);
  lVar2 = *(long *)((long)this + uVar4 + 0x18);
  (__return_storage_ptr__->first).inner_ = (Inner *)((long)this + uVar4);
  (__return_storage_ptr__->first).inner_end_ = (Inner *)((long)this + 0x400);
  (__return_storage_ptr__->first).it_.ctrl_ = local_40.first.ctrl_;
  (__return_storage_ptr__->first).it_.field_1 = local_40.first.field_1;
  (__return_storage_ptr__->first).it_end_.ctrl_ = (ctrl_t *)(lVar1 + lVar2);
  __return_storage_ptr__->second = local_40.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, Args&&... args)
    {
        size_t hashval = HashElement{hash_ref()}(key);
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        typename Lockable::UniqueLock m(inner);
        return make_rv(&inner, set.emplace_decomposable(key, hashval, std::forward<Args>(args)...));
    }